

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cpp
# Opt level: O0

size_t sznet::detail::convert<unsigned_int>(char *buf,uint value)

{
  uint uVar1;
  char *__last;
  char *pcStack_20;
  int lsd;
  char *p;
  uint i;
  uint value_local;
  char *buf_local;
  
  pcStack_20 = buf;
  p._0_4_ = value;
  do {
    uVar1 = (uint)p % 10;
    p._0_4_ = (uint)p / 10;
    __last = pcStack_20 + 1;
    *pcStack_20 = *(char *)(zero + (int)uVar1);
    pcStack_20 = __last;
  } while ((uint)p != 0);
  *__last = '\0';
  std::reverse<char*>(buf,__last);
  return (long)__last - (long)buf;
}

Assistant:

size_t convert(char buf[], T value)
	{
		T i = value;
		char* p = buf;
		// 201 分别取数字 1 0 2
		do
		{
			int lsd = static_cast<int>(i % 10);
			i /= 10;
			*p++ = zero[lsd];
		} while (i != 0);
		// 判断 value 是否为负数
		if (value < 0)
		{
			*p++ = '-';
		}
		*p = '\0';
		// 反转
		std::reverse(buf, p);
		// 返回转换后的长度
		return p - buf;
	}